

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall Diligent::GLContextState::SetColorWriteMask(GLContextState *this,Uint32 WriteMask)

{
  size_t rt;
  long lVar1;
  GLenum err;
  string msg;
  uint local_4c;
  string local_48;
  
  if (((this->m_bIndexedWriteMasks).m_EnableState == ENABLED) ||
     (this->m_ColorWriteMasks[0] != WriteMask)) {
    glColorMask(WriteMask & 1,(byte)(WriteMask >> 1) & 1,(byte)(WriteMask >> 2) & 1,
                (byte)WriteMask >> 3 & 1);
    local_4c = glGetError();
    if (local_4c != 0) {
      LogError<false,char[28],char[17],unsigned_int>
                (false,"SetColorWriteMask",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x366,(char (*) [28])"Failed to set GL color mask",
                 (char (*) [17])"\nGL Error Code: ",&local_4c);
      FormatString<char[6]>(&local_48,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"SetColorWriteMask",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x366);
      std::__cxx11::string::~string((string *)&local_48);
    }
    for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
      this->m_ColorWriteMasks[lVar1] = WriteMask;
    }
    (this->m_bIndexedWriteMasks).m_EnableState = DISABLED;
  }
  return;
}

Assistant:

void GLContextState::SetColorWriteMask(Uint32 WriteMask)
{
    // Even though the write mask only applies to writes to a framebuffer, the mask state is NOT
    // Framebuffer state. So it is NOT part of a Framebuffer Object or the Default Framebuffer.
    // Binding a new framebuffer will NOT affect the mask.
    if (!m_bIndexedWriteMasks && m_ColorWriteMasks[0] == WriteMask)
        return;

    // glColorMask() sets the mask for ALL draw buffers
    glColorMask(
        (WriteMask & COLOR_MASK_RED) ? GL_TRUE : GL_FALSE,
        (WriteMask & COLOR_MASK_GREEN) ? GL_TRUE : GL_FALSE,
        (WriteMask & COLOR_MASK_BLUE) ? GL_TRUE : GL_FALSE,
        (WriteMask & COLOR_MASK_ALPHA) ? GL_TRUE : GL_FALSE);
    DEV_CHECK_GL_ERROR("Failed to set GL color mask");

    for (size_t rt = 0; rt < _countof(m_ColorWriteMasks); ++rt)
        m_ColorWriteMasks[rt] = WriteMask;

    m_bIndexedWriteMasks = false;
}